

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O2

pair<std::shared_ptr<cornelich::region>,_long> * __thiscall
cornelich::vanilla_index::append
          (pair<std::shared_ptr<cornelich::region>,_long> *__return_storage_ptr__,
          vanilla_index *this,int32_t cycle,int64_t index_value,int32_t file_number)

{
  int64_t iVar1;
  logic_error *this_00;
  string local_1f8;
  string local_1d8 [32];
  region_ptr region;
  ostream local_1a8 [376];
  
  do {
    if (9999 < file_number) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::stringstream((stringstream *)&region);
      std::operator<<(local_1a8,"Unable to write index");
      std::ostream::_M_insert<long>((long)local_1a8);
      std::operator<<(local_1a8,"on cycle ");
      std::ostream::operator<<((ostream *)local_1a8,cycle);
      std::operator<<(local_1a8,"(");
      cycle_formatter::date_from_cycle_abi_cxx11_
                (&local_1f8,
                 (this->m_settings->m_cycle_format).
                 super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (long)cycle);
      std::operator<<(local_1a8,(string *)&local_1f8);
      std::operator<<(local_1a8,")");
      std::__cxx11::stringbuf::str();
      std::logic_error::logic_error(this_00,local_1d8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    index_for((vanilla_index *)&region,(int32_t)this,cycle,SUB41(file_number,0));
    if (region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      iVar1 = append(region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,index_value);
      if (-1 < iVar1) {
        std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)
                   __return_storage_ptr__,
                   &region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
        __return_storage_ptr__->second = iVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return __return_storage_ptr__;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    file_number = file_number + 1;
  } while( true );
}

Assistant:

std::pair<region_ptr, std::int64_t> vanilla_index::append(std::int32_t cycle, std::int64_t index_value, std::int32_t file_number)
{
    for (int index_count = file_number; index_count < 10000; ++index_count)
    {
        auto region = index_for(cycle, index_count, true);
        if(!region)
            continue;
        auto position = append(*region, index_value);
        if (position >= 0) {
            return {region, position};
        }
    }

    throw std::logic_error((util::streamer()
                            << "Unable to write index" << index_value
                            << "on cycle " << cycle
                            << "(" <<  m_settings.cycle_format().date_from_cycle(cycle) << ")").str());
}